

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readObject(Reader *this,Token *param_1)

{
  bool bVar1;
  _Elt_pointer ppVVar2;
  string name;
  Token comma;
  Token colon;
  Token tokenName;
  ValueHolder local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  Token local_78;
  Token local_60;
  Token local_48;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  Value::Value((Value *)local_b8,objectValue);
  ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::operator=(ppVVar2[-1],(Value *)local_b8);
  Value::~Value((Value *)local_b8);
  do {
    readToken(this,&local_48);
    while (local_48.type_ == tokenComment) {
      readToken(this,&local_48);
    }
    if (local_48.type_ == tokenObjectEnd) {
      if ((char *)local_98._M_string_length != (char *)0x0) {
LAB_0013fa39:
        local_b8[0].string_ = (char *)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"Missing \'}\' or object member name","");
        addError(this,(string *)local_b8,&local_48,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
LAB_0013fa77:
        if (local_b8[0] != &local_a8) {
          operator_delete(local_b8[0].string_,local_a8._M_allocated_capacity + 1);
        }
LAB_0013fa8d:
        bVar1 = false;
        goto LAB_0013fa93;
      }
      break;
    }
    if (local_48.type_ != tokenString) goto LAB_0013fa39;
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)local_98._M_string_length,0x17d263);
    bVar1 = decodeString(this,&local_48,&local_98);
    if (!bVar1) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0013fa8d;
    }
    readToken(this,&local_60);
    if (local_60.type_ != tokenMemberSeparator) {
      local_b8[0].string_ = (char *)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Missing \':\' after object member name","");
      addError(this,(string *)local_b8,&local_60,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0013fa77;
    }
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_b8[0].map_ = (ObjectValues *)Value::operator[](ppVVar2[-1],&local_98);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_b8[0].map_)
    ;
    bVar1 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar1) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0013fa8d;
    }
    readToken(this,&local_78);
    if ((tokenComment < local_78.type_) || ((0x1404U >> (local_78.type_ & 0x1f) & 1) == 0)) {
      local_b8[0].string_ = (char *)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(string *)local_b8,&local_78,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0013fa77;
    }
    while (local_78.type_ == tokenComment) {
      readToken(this,&local_78);
    }
  } while (local_78.type_ != tokenObjectEnd);
  bVar1 = true;
LAB_0013fa93:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool 
Reader::readObject( Token &/*tokenStart*/ )
{
   Token tokenName;
   std::string name;
   currentValue() = Value( objectValue );
   while ( readToken( tokenName ) )
   {
      bool initialTokenOk = true;
      while ( tokenName.type_ == tokenComment  &&  initialTokenOk )
         initialTokenOk = readToken( tokenName );
      if  ( !initialTokenOk )
         break;
      if ( tokenName.type_ == tokenObjectEnd  &&  name.empty() )  // empty object
         return true;
      if ( tokenName.type_ != tokenString )
         break;
      
      name = "";
      if ( !decodeString( tokenName, name ) )
         return recoverFromError( tokenObjectEnd );

      Token colon;
      if ( !readToken( colon ) ||  colon.type_ != tokenMemberSeparator )
      {
         return addErrorAndRecover( "Missing ':' after object member name", 
                                    colon, 
                                    tokenObjectEnd );
      }
      Value &value = currentValue()[ name ];
      nodes_.push( &value );
      bool ok = readValue();
      nodes_.pop();
      if ( !ok ) // error already set
         return recoverFromError( tokenObjectEnd );

      Token comma;
      if ( !readToken( comma )
            ||  ( comma.type_ != tokenObjectEnd  &&  
                  comma.type_ != tokenArraySeparator &&
                  comma.type_ != tokenComment ) )
      {
         return addErrorAndRecover( "Missing ',' or '}' in object declaration", 
                                    comma, 
                                    tokenObjectEnd );
      }
      bool finalizeTokenOk = true;
      while ( comma.type_ == tokenComment &&
              finalizeTokenOk )
         finalizeTokenOk = readToken( comma );
      if ( comma.type_ == tokenObjectEnd )
         return true;
   }
   return addErrorAndRecover( "Missing '}' or object member name", 
                              tokenName, 
                              tokenObjectEnd );
}